

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::coap::
CoapTest_CoapMessageOptions_MultipleOptionsSerializationAndDeserialization_Test::
~CoapTest_CoapMessageOptions_MultipleOptionsSerializationAndDeserialization_Test
          (CoapTest_CoapMessageOptions_MultipleOptionsSerializationAndDeserialization_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(CoapTest, CoapMessageOptions_MultipleOptionsSerializationAndDeserialization)
{
    auto      message = std::make_shared<Message>(Type::kConfirmable, Code::kGet);
    ByteArray buffer;
    Error     error;

    EXPECT_EQ(message->SetUriPath(".well-known/est/rv/"), ErrorCode::kNone);
    EXPECT_EQ(message->SetContentFormat(ContentFormat::kCBOR), ErrorCode::kNone);
    EXPECT_EQ(message->SetAccept(ContentFormat::kCoseSign1), ErrorCode::kNone);
    EXPECT_EQ(message->GetOptionNum(), 3);
    EXPECT_EQ(message->Serialize(buffer), ErrorCode::kNone);

    auto expectedBuffer = ByteArray{0x40, 0x01,
                                    0x00, 0x00, // header
                                    0xbb, '.',
                                    'w',  'e',
                                    'l',  'l',
                                    '-',  'k',
                                    'n',  'o',
                                    'w',  'n', // uri-path
                                    0x03, 'e',
                                    's',  't', // uri-path
                                    0x02, 'r',
                                    'v',                                              // uri-path
                                    0x11, utils::to_underlying(ContentFormat::kCBOR), // content-format
                                    0x51, utils::to_underlying(ContentFormat::kCoseSign1)};

    EXPECT_EQ(buffer, expectedBuffer);

    message = Message::Deserialize(error, buffer);
    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetOptionNum(), 3);

    ContentFormat contentFormat;
    EXPECT_EQ(message->GetContentFormat(contentFormat), ErrorCode::kNone);
    EXPECT_EQ(contentFormat, ContentFormat::kCBOR);

    std::string uriPath;
    EXPECT_EQ(message->GetUriPath(uriPath), ErrorCode::kNone);

    // ".well-known/est/rv/" is normalized to "/.well-known/est/rv"
    EXPECT_EQ(uriPath, "/.well-known/est/rv");

    ContentFormat accept;
    EXPECT_EQ(message->GetAccept(accept), ErrorCode::kNone);
    EXPECT_EQ(accept, ContentFormat::kCoseSign1);
}